

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItaniumDemangle.cpp
# Opt level: O0

void __thiscall anon_unknown.dwarf_426d84::QualType::printLeft(QualType *this,OutputStream *S)

{
  OutputStream *S_local;
  QualType *this_local;
  
  (*this->Child->_vptr_Node[4])(this->Child,S);
  printQuals(this,S);
  return;
}

Assistant:

void printLeft(OutputStream &S) const override {
    Child->printLeft(S);
    printQuals(S);
  }